

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCCollisionTree.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionTree::UpdateAbsoluteAABB(ChCollisionTree *this,double envelope)

{
  ChBody *pCVar1;
  int iVar2;
  ChVector<double> cmin;
  ChVector<double> cmax;
  ChMatrix33<double> *local_58;
  double dStack_50;
  double local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  if (this->m_body != (ChBody *)0x0) {
    ChAbsoluteAABB<chrono::collision::ChCollisionTree>::init
              (&this->m_absoluteAABB,(EVP_PKEY_CTX *)this);
    if (UpdateAbsoluteAABB(double)::at == '\0') {
      iVar2 = __cxa_guard_acquire(&UpdateAbsoluteAABB(double)::at);
      if (iVar2 != 0) {
        local_58 = &(this->m_body->super_ChBodyFrame).super_ChFrameMoving<double>.
                    super_ChFrame<double>.Amatrix;
        ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                  (&UpdateAbsoluteAABB::at,
                   (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_58
                  );
        __cxa_guard_release(&UpdateAbsoluteAABB(double)::at);
      }
    }
    local_58 = (ChMatrix33<double> *)0x0;
    dStack_50 = 0.0;
    local_48 = 0.0;
    local_28 = 0.0;
    local_38 = 0.0;
    dStack_30 = 0.0;
    (*this->_vptr_ChCollisionTree[6])(this,&local_58,&local_38,&UpdateAbsoluteAABB::at);
    pCVar1 = this->m_body;
    (this->m_absoluteAABB).m_beginX.m_value =
         ((double)local_58 - envelope) +
         (pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
         m_data[0];
    (this->m_absoluteAABB).m_endX.m_value =
         envelope + local_38 +
         (pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
         m_data[0];
    (this->m_absoluteAABB).m_beginY.m_value =
         (dStack_50 - envelope) +
         (pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
         m_data[1];
    (this->m_absoluteAABB).m_endY.m_value =
         envelope + dStack_30 +
         (pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
         m_data[1];
    (this->m_absoluteAABB).m_beginZ.m_value =
         (local_48 - envelope) +
         (pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
         m_data[2];
    (this->m_absoluteAABB).m_endZ.m_value =
         envelope + local_28 +
         (pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
         m_data[2];
    return;
  }
  __assert_fail("m_body",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/edgetempest/ChCCollisionTree.cpp"
                ,0x5f,"void chrono::collision::ChCollisionTree::UpdateAbsoluteAABB(double)");
}

Assistant:

void ChCollisionTree::UpdateAbsoluteAABB(double envelope) {
    assert(m_body);

    m_absoluteAABB.init(this);

    static ChMatrix33<> at = m_body->GetA().transpose();
    ChVector<> cmin;
    ChVector<> cmax;
    GetBoundingBox(cmin, cmax, at);

    m_absoluteAABB.m_beginX.m_value = cmin.x() - envelope + m_body->GetPos().x();
    m_absoluteAABB.m_endX.m_value = cmax.x() + envelope + m_body->GetPos().x();
    m_absoluteAABB.m_beginY.m_value = cmin.y() - envelope + m_body->GetPos().y();
    m_absoluteAABB.m_endY.m_value = cmax.y() + envelope + m_body->GetPos().y();
    m_absoluteAABB.m_beginZ.m_value = cmin.z() - envelope + m_body->GetPos().z();
    m_absoluteAABB.m_endZ.m_value = cmax.z() + envelope + m_body->GetPos().z();
}